

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O3

sat_iterator
pstore::storage::slice_region_into_segments
          (shared_ptr<pstore::memory_mapper_base> *region,sat_iterator segment_it,
          sat_iterator segment_end)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  void *__tmp;
  element_type *peVar2;
  element_type *peVar3;
  
  peVar1 = (region->super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar2 = (peVar1->ptr_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this = (peVar1->ptr_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0011847e;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_0011846f;
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
LAB_0011846f:
    this->_M_use_count = this->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  peVar1 = (region->super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
LAB_0011847e:
  if (0 < (long)peVar1->size_) {
    peVar3 = (element_type *)(peVar1->size_ + (long)peVar2);
    do {
      if (segment_it == segment_end) {
        assert_failed("segment_it != segment_end",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                      ,0xae);
      }
      if (((segment_it->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (element_type *)0x0) ||
         ((segment_it->region).
          super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        assert_failed("segment.value == nullptr && segment.region == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                      ,0xb0);
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      (segment_it->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      this_00 = (segment_it->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
      (segment_it->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      (segment_it->region).
      super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (region->super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(segment_it->region).
                  super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(region->
                  super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      segment_it = segment_it + 1;
      peVar2 = (element_type *)((long)peVar2 + 0x400000);
    } while (peVar2 < peVar3);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return segment_it;
}

Assistant:

auto storage::slice_region_into_segments (std::shared_ptr<memory_mapper_base> const & region,
                                              sat_iterator segment_it,
                                              sat_iterator const segment_end) -> sat_iterator {

        (void) segment_end; // silence unused argument warning in release build.
        std::shared_ptr<void> const data = region->data ();

        auto ptr = std::static_pointer_cast<std::uint8_t> (data).get ();
        auto const end = ptr + region->size ();
        for (; ptr < end; ptr += address::segment_size) {
            PSTORE_ASSERT (segment_it != segment_end);
            sat_entry & segment = *segment_it;
            PSTORE_ASSERT (segment.value == nullptr && segment.region == nullptr);

            // The segment's memory (at 'ptr') is managed by the 'data' shared_ptr.
            segment.value = std::shared_ptr<void> (data, ptr);
            segment.region = region;

            ++segment_it;
        }
        return segment_it;
    }